

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

void slang::ast::Statement::bindScopeInitializers
               (ASTContext *context,SmallVectorBase<const_slang::ast::Statement_*> *results)

{
  SourceLocation startLoc;
  bool bVar1;
  SourceLocation endLoc;
  SourceLocation *in_RSI;
  SourceRange range;
  VariableSymbol *var;
  Symbol *member;
  iterator __end2;
  iterator __begin2;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *__range2;
  Compilation *comp;
  Scope *scope;
  iterator *in_stack_ffffffffffffff58;
  SmallVectorBase<const_slang::ast::Statement_*> *in_stack_ffffffffffffff60;
  SourceLocation *in_stack_ffffffffffffff68;
  Scope *in_stack_ffffffffffffff70;
  SourceRange *args_1;
  VariableSymbol *in_stack_ffffffffffffff78;
  SourceRange local_70;
  bitmask<slang::ast::VariableFlags> local_5a;
  VariableSymbol *local_58;
  Symbol *local_50;
  Symbol *local_48;
  Symbol *local_40;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  local_38;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *local_28;
  Compilation *local_20;
  Scope *local_18;
  SourceLocation *local_10;
  
  local_10 = in_RSI;
  local_18 = not_null<const_slang::ast::Scope_*>::operator*
                       ((not_null<const_slang::ast::Scope_*> *)0x4b4a74);
  local_20 = Scope::getCompilation(local_18);
  local_38 = Scope::members(in_stack_ffffffffffffff70);
  local_28 = &local_38;
  local_40 = (Symbol *)
             std::ranges::
             subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
             ::begin(local_28);
  local_48 = (Symbol *)
             std::ranges::
             subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
             ::end(local_28);
  while (bVar1 = operator==<slang::ast::Scope::iterator>
                           ((self_type *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_50 = iterator_facade<slang::ast::Scope::iterator,_false>::operator*
                         ((iterator_facade<slang::ast::Scope::iterator,_false> *)0x4b4afd);
    if (local_50->kind == Variable) {
      local_58 = Symbol::as<slang::ast::VariableSymbol>((Symbol *)0x4b4b1b);
      args_1 = (SourceRange *)&local_58->flags;
      bitmask<slang::ast::VariableFlags>::bitmask(&local_5a,CompilerGenerated);
      bVar1 = bitmask<slang::ast::VariableFlags>::has
                        ((bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff60,
                         (bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff58);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        startLoc = (local_58->super_ValueSymbol).super_Symbol.location;
        in_stack_ffffffffffffff60 =
             (SmallVectorBase<const_slang::ast::Statement_*> *)
             &(local_58->super_ValueSymbol).super_Symbol.location;
        std::basic_string_view<char,_std::char_traits<char>_>::length
                  (&(local_58->super_ValueSymbol).super_Symbol.name);
        endLoc = SourceLocation::operator+<unsigned_long>
                           (in_stack_ffffffffffffff68,(unsigned_long)in_stack_ffffffffffffff60);
        SourceRange::SourceRange(&local_70,startLoc,endLoc);
        in_stack_ffffffffffffff68 = local_10;
        in_stack_ffffffffffffff78 =
             (VariableSymbol *)
             BumpAllocator::
             emplace<slang::ast::VariableDeclStatement,slang::ast::VariableSymbol_const&,slang::SourceRange&>
                       ((BumpAllocator *)endLoc,in_stack_ffffffffffffff78,args_1);
        SmallVectorBase<const_slang::ast::Statement_*>::push_back
                  (in_stack_ffffffffffffff60,(Statement **)in_stack_ffffffffffffff58);
      }
    }
    iterator_facade<slang::ast::Scope::iterator,_false>::operator++<slang::ast::Scope::iterator>
              ((iterator_facade<slang::ast::Scope::iterator,_false> *)in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

void Statement::bindScopeInitializers(const ASTContext& context,
                                      SmallVectorBase<const Statement*>& results) {
    // This relies on the language requiring all declarations be at the
    // start of a statement block. Additional work would be required to
    // support declarations anywhere in the block, because as written all
    // of the initialization will happen at the start of the block, which
    // might have different side-effects than if they were initialized in
    // the middle somewhere. The parser currently enforces this for us.
    auto& scope = *context.scope;
    auto& comp = scope.getCompilation();
    for (auto& member : scope.members()) {
        if (member.kind != SymbolKind::Variable)
            continue;

        // Filter out implicitly generated function return type variables -- they are
        // initialized elsewhere. Note that we manufacture a somewhat reasonable
        // source range here, since we don't have the real one.
        auto& var = member.as<VariableSymbol>();
        if (!var.flags.has(VariableFlags::CompilerGenerated)) {
            SourceRange range{var.location, var.location + var.name.length()};
            results.push_back(comp.emplace<VariableDeclStatement>(var, range));
        }
    }
}